

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::Generators::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  pointer psVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  _func_int **pp_Var5;
  ITracker *pIVar6;
  shared_ptr<Catch::TestCaseTracking::ITracker> *child;
  pointer psVar7;
  undefined4 extraout_var;
  
  uVar2 = TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  _Var4._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar2;
  if (((this->super_TrackerBase).m_children.
       super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->super_TrackerBase).m_children.
       super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (_Var4._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)std::operator()(),
     _Var4._M_current ==
     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
     (this->super_TrackerBase).m_children.
     super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    pIVar6 = (this->super_TrackerBase).m_parent;
    pp_Var5 = pIVar6->_vptr_ITracker;
    while (iVar3 = (*pp_Var5[0xe])(pIVar6), (char)iVar3 == '\0') {
      iVar3 = (*pIVar6->_vptr_ITracker[7])(pIVar6);
      pIVar6 = (ITracker *)CONCAT44(extraout_var,iVar3);
      pp_Var5 = pIVar6->_vptr_ITracker;
    }
    _Var4._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pIVar6[1].m_nameAndLocation.location.line;
    if (_Var4._M_current ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pIVar6[2]._vptr_ITracker) goto LAB_0014cd5a;
    psVar1 = (this->super_TrackerBase).m_children.
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar7 = (this->super_TrackerBase).m_children.
                  super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1)
    {
      uVar2 = (*((psVar7->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[0xe])();
      _Var4._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar2;
      if (((char)uVar2 != '\0') &&
         (_Var4 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (pIVar6[1].m_nameAndLocation.location.line,pIVar6[2]._vptr_ITracker,
                             &(psVar7->
                              super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr[2].m_nameAndLocation.name._M_string_length),
         _Var4._M_current !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pIVar6[2]._vptr_ITracker)) goto LAB_0014cd5a;
    }
  }
  if ((this->super_TrackerBase).m_runState != CompletedSuccessfully) {
    return (int)_Var4._M_current;
  }
  iVar3 = (*((this->m_generator)._M_t.
             super___uniq_ptr_impl<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::Generators::GeneratorUntypedBase_*,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
             .super__Head_base<0UL,_Catch::Generators::GeneratorUntypedBase_*,_false>._M_head_impl)
            ->_vptr_GeneratorUntypedBase[2])();
  if ((char)iVar3 == '\0') {
    return iVar3;
  }
LAB_0014cd5a:
  clara::std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::clear(&(this->super_TrackerBase).m_children);
  (this->super_TrackerBase).m_runState = Executing;
  return extraout_EAX;
}

Assistant:

void close() override {
                TrackerBase::close();
                // If a generator has a child (it is followed by a section)
                // and none of its children have started, then we must wait
                // until later to start consuming its values.
                // This catches cases where `GENERATE` is placed between two
                // `SECTION`s.
                // **The check for m_children.empty cannot be removed**.
                // doing so would break `GENERATE` _not_ followed by `SECTION`s.
                const bool should_wait_for_child = [&]() {
                    // No children -> nobody to wait for
                    if ( m_children.empty() ) {
                        return false;
                    }
                    // If at least one child started executing, don't wait
                    if ( std::find_if(
                             m_children.begin(),
                             m_children.end(),
                             []( TestCaseTracking::ITrackerPtr tracker ) {
                                 return tracker->hasStarted();
                             } ) != m_children.end() ) {
                        return false;
                    }

                    // No children have started. We need to check if they _can_
                    // start, and thus we should wait for them, or they cannot
                    // start (due to filters), and we shouldn't wait for them
                    auto* parent = m_parent;
                    // This is safe: there is always at least one section
                    // tracker in a test case tracking tree
                    while ( !parent->isSectionTracker() ) {
                        parent = &( parent->parent() );
                    }
                    assert( parent &&
                            "Missing root (test case) level section" );

                    auto const& parentSection =
                        static_cast<SectionTracker&>( *parent );
                    auto const& filters = parentSection.getFilters();
                    // No filters -> no restrictions on running sections
                    if ( filters.empty() ) {
                        return true;
                    }

                    for ( auto const& child : m_children ) {
                        if ( child->isSectionTracker() &&
                             std::find( filters.begin(),
                                        filters.end(),
                                        static_cast<SectionTracker&>( *child )
                                            .trimmedName() ) !=
                                 filters.end() ) {
                            return true;
                        }
                    }
                    return false;
                }();

                // This check is a bit tricky, because m_generator->next()
                // has a side-effect, where it consumes generator's current
                // value, but we do not want to invoke the side-effect if
                // this generator is still waiting for any child to start.
                if ( should_wait_for_child ||
                     ( m_runState == CompletedSuccessfully &&
                       m_generator->next() ) ) {
                    m_children.clear();
                    m_runState = Executing;
                }
            }